

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiInApi::cancelCallback(MidiInApi *this)

{
  string *psVar1;
  string sStack_38;
  
  if ((this->inputData_).usingCallback == false) {
    psVar1 = &(this->super_MidiApi).errorString_;
    std::__cxx11::string::assign((char *)psVar1);
    std::__cxx11::string::string((string *)&sStack_38,(string *)psVar1);
    MidiApi::error(&this->super_MidiApi,WARNING,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  else {
    (this->inputData_).usingCallback = false;
    (this->inputData_).userCallback = (RtMidiCallback)0x0;
    (this->inputData_).userData = (void *)0x0;
  }
  return;
}

Assistant:

void MidiInApi :: cancelCallback()
{
  if ( !inputData_.usingCallback ) {
    errorString_ = "RtMidiIn::cancelCallback: no callback function was set!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  inputData_.userCallback = 0;
  inputData_.userData = 0;
  inputData_.usingCallback = false;
}